

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O0

void __thiscall FDDSTexture::MakeTexture(FDDSTexture *this)

{
  BYTE *pBVar1;
  undefined1 local_48 [8];
  FWadLump lump;
  FDDSTexture *this_local;
  
  lump.Lump = (FResourceLump *)this;
  FWadCollection::OpenLumpNum((FWadLump *)local_48,&Wads,(this->super_FTexture).SourceLump);
  pBVar1 = (BYTE *)operator_new__((long)(int)((uint)(this->super_FTexture).Width *
                                             (uint)(this->super_FTexture).Height));
  this->Pixels = pBVar1;
  FWadLump::Seek((FWadLump *)local_48,0x80,0);
  if ((this->Format == 0) || (4 < this->Format)) {
    if (this->Format == 0x31545844) {
      DecompressDXT1(this,(FWadLump *)local_48,(BYTE *)0x0);
    }
    else if ((this->Format == 0x33545844) || (this->Format == 0x32545844)) {
      DecompressDXT3(this,(FWadLump *)local_48,this->Format == 0x32545844,(BYTE *)0x0);
    }
    else if ((this->Format == 0x35545844) || (this->Format == 0x34545844)) {
      DecompressDXT5(this,(FWadLump *)local_48,this->Format == 0x34545844,(BYTE *)0x0);
    }
  }
  else {
    ReadRGB(this,(FWadLump *)local_48,(BYTE *)0x0);
  }
  FWadLump::~FWadLump((FWadLump *)local_48);
  return;
}

Assistant:

void FDDSTexture::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);

	Pixels = new BYTE[Width*Height];

	lump.Seek (sizeof(DDSURFACEDESC2) + 4, SEEK_SET);

	if (Format >= 1 && Format <= 4)		// RGB: Format is # of bytes per pixel
	{
		ReadRGB (lump);
	}
	else if (Format == ID_DXT1)
	{
		DecompressDXT1 (lump);
	}
	else if (Format == ID_DXT3 || Format == ID_DXT2)
	{
		DecompressDXT3 (lump, Format == ID_DXT2);
	}
	else if (Format == ID_DXT5 || Format == ID_DXT4)
	{
		DecompressDXT5 (lump, Format == ID_DXT4);
	}
}